

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

int async_sign_ctx_get_fd(ptls_async_job_t *_self)

{
  size_t numfds;
  int fds [1];
  long local_20;
  int local_14;
  
  ASYNC_WAIT_CTX_get_all_fds(_self[1].set_completion_callback,0,&local_20);
  if (local_20 == 1) {
    ASYNC_WAIT_CTX_get_all_fds(_self[1].set_completion_callback,&local_14,&local_20);
    return local_14;
  }
  __assert_fail("numfds == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/openssl.c",
                0x3a3,"int async_sign_ctx_get_fd(ptls_async_job_t *)");
}

Assistant:

int async_sign_ctx_get_fd(ptls_async_job_t *_self)
{
    struct async_sign_ctx *self = (void *)_self;
    OSSL_ASYNC_FD fds[1];
    size_t numfds;

    ASYNC_WAIT_CTX_get_all_fds(self->waitctx, NULL, &numfds);
    assert(numfds == 1);
    ASYNC_WAIT_CTX_get_all_fds(self->waitctx, fds, &numfds);
    return (int)fds[0];
}